

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::ConnectionCounter::~ConnectionCounter
          (ConnectionCounter *this)

{
  ConcurrencyLimitingHttpClient *pCVar1;
  Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  *this_00;
  PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *pPVar2;
  _Map_pointer ppOVar3;
  uint uVar4;
  int iVar5;
  _Elt_pointer pOVar6;
  Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  fulfiller;
  ConnectionCounter local_40;
  Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  local_38;
  
  pCVar1 = this->parent;
  if (pCVar1 != (ConcurrencyLimitingHttpClient *)0x0) {
    uVar4 = pCVar1->concurrentRequests - 1;
    pCVar1->concurrentRequests = uVar4;
    while ((uVar4 < pCVar1->maxConcurrentRequests &&
           (this_00 = (pCVar1->pendingRequests).c.
                      super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur,
           (pCVar1->pendingRequests).c.
           super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur != this_00))) {
      local_38.disposer = this_00->disposer;
      pPVar2 = this_00->ptr;
      this_00->ptr = (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                      *)0x0;
      local_38.ptr = pPVar2;
      if (this_00 ==
          (pCVar1->pendingRequests).c.
          super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
        ::~Own(this_00);
        operator_delete((pCVar1->pendingRequests).c.
                        super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        ppOVar3 = (pCVar1->pendingRequests).c.
                  super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        (pCVar1->pendingRequests).c.
        super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node = ppOVar3 + 1;
        pOVar6 = ppOVar3[1];
        (pCVar1->pendingRequests).c.
        super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first = pOVar6;
        (pCVar1->pendingRequests).c.
        super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last = pOVar6 + 0x20;
      }
      else {
        Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
        ::~Own(this_00);
        pOVar6 = (pCVar1->pendingRequests).c.
                 super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      (pCVar1->pendingRequests).c.
      super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur = pOVar6;
      iVar5 = (*(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[1])(pPVar2);
      if ((char)iVar5 != '\0') {
        pCVar1->concurrentRequests = pCVar1->concurrentRequests + 1;
        local_40.parent = pCVar1;
        (*(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar2,&local_40);
        ~ConnectionCounter(&local_40);
      }
      Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
      ::~Own(&local_38);
      uVar4 = pCVar1->concurrentRequests;
    }
    fireCountChanged(this->parent);
  }
  return;
}

Assistant:

~ConnectionCounter() noexcept(false) {
      if (parent != nullptr) {
        --parent->concurrentRequests;
        parent->serviceQueue();
        parent->fireCountChanged();
      }
    }